

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

int tlp_cpld_data_length(tlp_cpl_hdr *ch)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = (ch->tlp).falen;
  uVar3 = (ushort)(uVar1 << 8 | uVar1 >> 8) & 0x3ff;
  uVar4 = ch->lowaddr & 3;
  uVar5 = (uint)(ushort)((ch->stcnt & 0xff0f) << 8 | ch->stcnt >> 8);
  uVar2 = uVar3 * 4 - uVar4;
  if (uVar4 + uVar5 + 3 >> 2 == uVar3) {
    uVar2 = uVar5;
  }
  return uVar2;
}

Assistant:

int tlp_cpld_data_length(struct tlp_cpl_hdr *ch)
{
	/* if this is last CplD, byte count is actual byte length */
	if (tlp_length(ch->tlp.falen) ==
	    ((ch->lowaddr & 0x3) + tlp_cpl_bcnt(ch->stcnt) + 3) >> 2)
		return tlp_cpl_bcnt(ch->stcnt);

	/* if not, length - padding due to 4DW alignment */
	return (tlp_length(ch->tlp.falen) << 2) - (ch->lowaddr & 0x3);
}